

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

LargeObjectHeader * __thiscall
Memory::LargeObjectHeader::GetNext(LargeObjectHeader *this,uint cookie)

{
  ushort uVar1;
  LargeObjectHeader *pLVar2;
  byte calculatedChecksum;
  uint uVar3;
  
  pLVar2 = this->next;
  uVar1 = this->attributesAndChecksum ^ (ushort)cookie;
  uVar3 = (uint)pLVar2 ^ cookie;
  calculatedChecksum =
       (byte)(uVar3 >> 0x18) ^ (byte)uVar3 ^ (byte)(uVar3 >> 0x10) ^ (byte)(uVar3 >> 8) ^
       (byte)(uVar1 >> 8);
  if (calculatedChecksum != (byte)uVar1) {
    LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this,calculatedChecksum);
    pLVar2 = this->next;
  }
  return (LargeObjectHeader *)((ulong)cookie ^ (ulong)pLVar2);
}

Assistant:

LargeObjectHeader *
LargeObjectHeader::GetNext(uint cookie)
{
#ifdef LARGEHEAPBLOCK_ENCODING
    LargeObjectHeader *decodedNext = this->DecodeNext(cookie, this->next);
    ushort decodedAttributesAndChecksum = this->DecodeAttributesAndChecksum(cookie);

    unsigned char checkSum = (unsigned char)(decodedAttributesAndChecksum & 0xFF);
    unsigned char calculatedCheckSumField = this->CalculateCheckSum(decodedNext, (unsigned char)(decodedAttributesAndChecksum >> 8));
    if (checkSum != calculatedCheckSumField)
    {
        LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this, calculatedCheckSumField);
    }
    // If checksum matches return the up-to-date next (in case other thread changed it from last time
    // we read it in this method.
    return this->DecodeNext(cookie, this->next);

#else
    return this->next;
#endif
}